

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::Schema>
reflection::CreateSchema
          (FlatBufferBuilder *_fbb,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>_>
          objects,Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>_>
                  enums,Offset<flatbuffers::String> file_ident,Offset<flatbuffers::String> file_ext,
          Offset<reflection::Object> root_table,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_>
          services,AdvancedFeatures advanced_features,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_>
          fbs_files)

{
  Offset<reflection::Schema> OVar1;
  SchemaBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  SchemaBuilder::add_advanced_features(&local_40,advanced_features);
  SchemaBuilder::add_fbs_files(&local_40,fbs_files);
  SchemaBuilder::add_services(&local_40,services);
  SchemaBuilder::add_root_table(&local_40,root_table);
  SchemaBuilder::add_file_ext(&local_40,file_ext);
  SchemaBuilder::add_file_ident(&local_40,file_ident);
  SchemaBuilder::add_enums(&local_40,enums);
  SchemaBuilder::add_objects(&local_40,objects);
  OVar1 = SchemaBuilder::Finish(&local_40);
  return (Offset<reflection::Schema>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Schema> CreateSchema(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::Object>>> objects = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::Enum>>> enums = 0,
    ::flatbuffers::Offset<::flatbuffers::String> file_ident = 0,
    ::flatbuffers::Offset<::flatbuffers::String> file_ext = 0,
    ::flatbuffers::Offset<reflection::Object> root_table = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::Service>>> services = 0,
    reflection::AdvancedFeatures advanced_features = static_cast<reflection::AdvancedFeatures>(0),
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::SchemaFile>>> fbs_files = 0) {
  SchemaBuilder builder_(_fbb);
  builder_.add_advanced_features(advanced_features);
  builder_.add_fbs_files(fbs_files);
  builder_.add_services(services);
  builder_.add_root_table(root_table);
  builder_.add_file_ext(file_ext);
  builder_.add_file_ident(file_ident);
  builder_.add_enums(enums);
  builder_.add_objects(objects);
  return builder_.Finish();
}